

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O2

Term * Inferences::InductionHelper::getOtherTermFromComparison(Literal *l,Term *t)

{
  bool bVar1;
  TermList TVar2;
  uint i;
  uint n;
  
  bVar1 = anon_unknown_1::isIntegerComparisonLiteral(l);
  if (bVar1) {
    for (n = 0; n != 2; n = n + 1) {
      TVar2 = Kernel::Term::termArg(&l->super_Term,n);
      if ((Term *)TVar2._content == t) {
        TVar2 = Kernel::Term::termArg(&l->super_Term,1 - n);
        return (Term *)TVar2._content;
      }
    }
  }
  return (Term *)0x0;
}

Assistant:

Term* InductionHelper::getOtherTermFromComparison(Literal* l, Term* t) {
  if (isIntegerComparisonLiteral(l)) {
    ASS(l->ground());
    ASS_EQ(l->arity(),2);
    for (unsigned i = 0; i < 2; ++i) {
      if (l->termArg(i).term() == t) {
        return l->termArg(1-i).term();
      }
    }
  }
  return nullptr;
}